

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lexIntegerSuffix(Lexer *this,int suffixCnt)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  
  do {
    while( true ) {
      bVar3 = suffixCnt == 0;
      suffixCnt = suffixCnt + -1;
      if (bVar3) {
        return;
      }
      uVar1 = this->yychar_;
      if (uVar1 != 'L') break;
      yyinput(this);
      bVar2 = this->yychar_;
      if (bVar2 == 0x4c) {
LAB_002e416c:
        yyinput(this);
        bVar2 = this->yychar_;
      }
LAB_002e4178:
      if ((bVar2 | 0x20) != 0x75) {
        return;
      }
    }
    if (uVar1 != 'u') {
      if (uVar1 == 'l') {
        yyinput(this);
        bVar2 = this->yychar_;
        if (bVar2 == 0x6c) goto LAB_002e416c;
        goto LAB_002e4178;
      }
      if (uVar1 != 'U') {
        return;
      }
    }
    yyinput(this);
    if ((this->yychar_ | 0x20) != 0x6c) {
      return;
    }
  } while( true );
}

Assistant:

void Lexer::lexIntegerSuffix(int suffixCnt)
{
    if (!suffixCnt)
        return;

    switch(yychar_) {
        case 'u':
        case 'U':
            yyinput();
            switch (yychar_) {
                case 'l':
                case 'L':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'l':
            yyinput();
            if (yychar_ == 'l')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;

        case 'L':
            yyinput();
            if (yychar_ == 'L')
                yyinput();
            switch (yychar_) {
                case 'u':
                case 'U':
                    lexIntegerSuffix(--suffixCnt);
                    break;
            }
            break;
    }
}